

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QUuid,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QDebug *in_RSI;
  long in_FS_OFFSET;
  QDebug in_stack_ffffffffffffffe8;
  QDebug *in_stack_fffffffffffffff0;
  QDebug *this;
  
  this = *(QDebug **)(in_FS_OFFSET + 0x28);
  QDebug::QDebug((QDebug *)&stack0xffffffffffffffe8,in_RSI);
  ::operator<<(in_stack_fffffffffffffff0,(QUuid *)in_stack_ffffffffffffffe8.stream);
  QDebug::~QDebug(this);
  QDebug::~QDebug(this);
  if (*(QDebug **)(in_FS_OFFSET + 0x28) == this) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }